

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLdimacs.c
# Opt level: O2

RDL_DimacsGraph * RDL_dimacsGraph_read(char *filename)

{
  RDL_node RVar1;
  RDL_node RVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  FILE *__stream;
  RDL_DimacsGraph *graph;
  char *pcVar6;
  size_t sVar7;
  RDL_cycle *pRVar8;
  RDL_edge *paRVar9;
  RDL_cycle **ppRVar10;
  char **ppcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint local_174;
  uint node2;
  uint local_16c;
  uint node1;
  uint ring;
  uint local_160;
  uint ring_size;
  ulong local_158;
  uint *local_150;
  uint *local_148;
  uint *local_140;
  char line [257];
  
  ring_size = 0;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    return (RDL_DimacsGraph *)0x0;
  }
  graph = (RDL_DimacsGraph *)malloc(0x30);
  local_148 = &graph->nof_cycles;
  graph->nof_cycles = 0;
  graph->name = (char *)0x0;
  local_150 = &graph->nof_nodes;
  local_140 = &graph->nof_edges;
  graph->edges = (RDL_edge *)0x0;
  graph->cycles = (RDL_cycle **)0x0;
  graph->sorted_cycles = (char **)0x0;
  iVar5 = 0;
  local_16c = 0;
  local_160 = 0;
  local_174 = 0;
  local_158 = 0;
LAB_0010afb3:
  do {
    bVar4 = false;
LAB_0010afb6:
    do {
      pcVar6 = fgets(line,0x100,__stream);
      uVar15 = local_160;
      if ((bVar4) || (pcVar6 == (char *)0x0)) {
        if (!bVar4) {
          uVar3 = *local_148;
          if (uVar3 == 0xffffffff) {
LAB_0010b567:
            bVar4 = true;
            if (local_16c == *local_140) goto LAB_0010b42b;
            (*RDL_outputFunc)(RDL_ERROR,"mismatch between number of edges!\n");
          }
          else {
            if (local_160 != uVar3) {
              (*RDL_outputFunc)(RDL_ERROR,"mismatch between number of cycles!\n");
            }
            if (((int)local_158 == 0) || (local_174 == graph->cycles[(int)local_158 - 1]->weight)) {
              if (uVar15 == uVar3) goto LAB_0010b567;
            }
            else {
              (*RDL_outputFunc)(RDL_ERROR,"last ring %u wasn\'t filled up!\n");
            }
          }
        }
        RDL_dimacsGraph_delete(graph);
        bVar4 = false;
        graph = (RDL_DimacsGraph *)0x0;
LAB_0010b42b:
        fclose(__stream);
        if (!bVar4) {
          return graph;
        }
        if (graph->cycles != (RDL_cycle **)0x0) {
          uVar12 = (ulong)graph->nof_cycles;
          ppcVar11 = (char **)malloc(uVar12 << 3);
          graph->sorted_cycles = ppcVar11;
          uVar13 = 0xffffffffffffffff;
          for (uVar16 = 0; uVar16 < uVar12; uVar16 = uVar16 + 1) {
            uVar15 = graph->nof_edges;
            pcVar6 = (char *)malloc((ulong)(uVar15 + 1));
            graph->sorted_cycles[uVar16] = pcVar6;
            memset(graph->sorted_cycles[uVar16],0,(ulong)uVar15);
            graph->sorted_cycles[uVar16][graph->nof_edges] = '\x02';
            for (uVar12 = 0; uVar12 < graph->cycles[uVar16]->weight; uVar12 = uVar12 + 1) {
              paRVar9 = graph->cycles[uVar16]->edges;
              RVar1 = paRVar9[uVar12][0];
              RVar2 = paRVar9[uVar12][1];
              for (uVar14 = 0; graph->nof_edges != uVar14; uVar14 = uVar14 + 1) {
                paRVar9 = graph->edges;
                if (((paRVar9[uVar14][0] == RVar1) && (paRVar9[uVar14][1] == RVar2)) ||
                   ((paRVar9[uVar14][0] == RVar2 && (paRVar9[uVar14][1] == RVar1)))) {
                  uVar13 = uVar14 & 0xffffffff;
                }
              }
              graph->sorted_cycles[uVar16][(int)uVar13] = '\x01';
            }
            uVar12 = (ulong)graph->nof_cycles;
          }
          qsort(graph->sorted_cycles,uVar12,8,RDL_cmp_cycles);
          return graph;
        }
        graph->sorted_cycles = (char **)0x0;
        return graph;
      }
      if (line[0] != 'c') {
        if (line[0] == 'e') {
          if (iVar5 == 1) {
            iVar5 = __isoc99_sscanf(line,"e %u %u",&node1,&node2);
            if (iVar5 == 0) {
              pcVar6 = "invalid edge specification line\n";
            }
            else if (local_16c == *local_140) {
              pcVar6 = "too many edges found!\n";
            }
            else {
              if (((node1 != 0) && (node1 <= *local_150)) && (node2 - 1 < *local_150)) {
                paRVar9 = graph->edges;
                paRVar9[local_16c][0] = node1;
                paRVar9[local_16c][1] = node2;
                local_16c = local_16c + 1;
                goto LAB_0010b409;
              }
              pcVar6 = "illegal edge specification!\n";
            }
LAB_0010b1f0:
            (*RDL_outputFunc)(RDL_ERROR,pcVar6);
            bVar4 = true;
            iVar5 = 1;
            goto LAB_0010afb6;
          }
          pcVar6 = "edge \'e\' found without \'p\' definition!\n";
        }
        else if (line[0] == 'r') {
          if (iVar5 == 0) {
            iVar5 = 0;
            pcVar6 = "ring \'r\' found without \'p\' definition!\n";
          }
          else {
            if (graph->cycles != (RDL_cycle **)0x0) {
              iVar5 = __isoc99_sscanf(line,"r %u %u %u %u",&ring,&ring_size,&node1,&node2);
              if (iVar5 == 4) {
                if ((ring != 0) && (ring <= *local_148)) {
                  if ((node1 == 0) || ((*local_150 < node1 || (*local_150 <= node2 - 1)))) {
                    pcVar6 = "illegal edge specification!\n";
                    goto LAB_0010b1a0;
                  }
                  uVar15 = (uint)local_158;
                  if (ring == uVar15) {
                    ppRVar10 = graph->cycles;
                    uVar12 = (ulong)(uVar15 - 1);
                    bVar4 = false;
                    uVar13 = (ulong)local_174;
                  }
                  else {
                    bVar4 = false;
                    if (uVar15 != 0) {
                      if (local_174 == graph->cycles[uVar15 - 1]->weight) {
                        if (ring == uVar15 + 1) goto LAB_0010b2b7;
                        (*RDL_outputFunc)(RDL_ERROR,
                                          "rings have to be continuous, \'%u\' follows on \'%u\'",
                                          (ulong)ring,local_158 & 0xffffffff);
                      }
                      else {
                        (*RDL_outputFunc)(RDL_ERROR,"last ring %u wasn\'t filled up!\n",
                                          local_158 & 0xffffffff);
                      }
                      bVar4 = true;
                    }
LAB_0010b2b7:
                    pRVar8 = (RDL_cycle *)malloc(0x18);
                    local_158 = (ulong)ring;
                    uVar12 = (ulong)(ring - 1);
                    graph->cycles[uVar12] = pRVar8;
                    ppRVar10 = graph->cycles;
                    pRVar8 = ppRVar10[uVar12];
                    pRVar8->weight = ring_size;
                    paRVar9 = (RDL_edge *)malloc((ulong)ring_size << 3);
                    pRVar8->edges = paRVar9;
                    local_160 = local_160 + 1;
                    uVar13 = 0;
                  }
                  local_174 = (uint)uVar13;
                  if (local_174 == ppRVar10[uVar12]->weight) {
                    (*RDL_outputFunc)(RDL_ERROR,"too many edges for ring!\n");
                    iVar5 = 2;
                    bVar4 = true;
                  }
                  else {
                    ppRVar10[uVar12]->edges[uVar13][0] = node1;
                    ppRVar10[ring - 1]->edges[uVar13][1] = node2;
                    local_174 = local_174 + 1;
                    iVar5 = 2;
                  }
                  goto LAB_0010afb6;
                }
                (*RDL_outputFunc)(RDL_ERROR,"invalid ring counter \'%u\'!\n");
              }
              else {
                pcVar6 = "invalid ring specification line\n";
LAB_0010b1a0:
                (*RDL_outputFunc)(RDL_ERROR,pcVar6);
              }
              iVar5 = 2;
              bVar4 = true;
              goto LAB_0010afb6;
            }
            pcVar6 = "ring \'r\' found without \'p\' definition for rings!\n";
          }
        }
        else if (line[0] == 'p') {
          if (iVar5 == 0) {
            iVar5 = __isoc99_sscanf(line,"p edge %u %u %u",local_150,local_140,local_148);
            if (iVar5 == 2) {
              paRVar9 = (RDL_edge *)malloc((ulong)graph->nof_edges << 3);
              graph->edges = paRVar9;
              graph->nof_cycles = 0xffffffff;
              graph->cycles = (RDL_cycle **)0x0;
            }
            else {
              if (iVar5 != 3) {
                pcVar6 = "invalid line starting with \'p\'\n";
                goto LAB_0010b1f0;
              }
              paRVar9 = (RDL_edge *)malloc((ulong)graph->nof_edges << 3);
              graph->edges = paRVar9;
              ppRVar10 = (RDL_cycle **)calloc(1,(ulong)graph->nof_cycles << 3);
              graph->cycles = ppRVar10;
            }
LAB_0010b409:
            iVar5 = 1;
            goto LAB_0010afb3;
          }
          pcVar6 = "duplicate \'p\' line found!\n";
        }
        else {
          pcVar6 = "invalid line!\n";
        }
        (*RDL_outputFunc)(RDL_ERROR,pcVar6);
        bVar4 = true;
        goto LAB_0010afb6;
      }
      sVar7 = strlen(line);
      bVar4 = false;
    } while ((sVar7 & 0xfffffffc) == 0 || graph->name != (char *)0x0);
    pcVar6 = (char *)malloc((ulong)((int)sVar7 - 2));
    graph->name = pcVar6;
    uVar13 = (ulong)((int)sVar7 - 3);
    strncpy(pcVar6,line + 2,uVar13);
    pcVar6[uVar13] = '\0';
  } while( true );
}

Assistant:

RDL_DimacsGraph* RDL_dimacsGraph_read(const char* filename)
{
  FILE* infile;
  RDL_DimacsGraph* graph = NULL;
  char line[RDL_MAXSIZE + 1];
  unsigned node1, node2, ring;
  int error = 0;
  int stage = 0;
  unsigned edge_counter = 0;
  unsigned ring_counter = 0;
  unsigned ring_position_counter = 0;
  unsigned last_ring = 0;
  unsigned ring_size = 0;
  unsigned ring_idx, edge_idx;
  unsigned eidx;
  int found_eidx = -1;
  int read_initializer = -1;
  unsigned len;
  RDL_edge edge;

  infile = fopen(filename, "r");

  if (!infile) {
    return graph;
  }

  graph = malloc(sizeof(*graph));
  graph->nof_cycles = 0;
  graph->edges = NULL;
  graph->cycles = NULL;
  graph->sorted_cycles = NULL;
  graph->name = NULL;

  while (fgets(line, RDL_MAXSIZE, infile) && !error) {
    if (line[0] == 'p') {
      if (!stage) {
        stage = 1;

        read_initializer = sscanf(line, "p edge %u %u %u", &graph->nof_nodes, &graph->nof_edges, &graph->nof_cycles);
        if (read_initializer == 3) {
          graph->edges = malloc(graph->nof_edges * sizeof(*graph->edges));
          graph->cycles = malloc(graph->nof_cycles * sizeof(*graph->cycles));
          memset(graph->cycles, 0, graph->nof_cycles * sizeof(*graph->cycles));
        }
        else if (read_initializer == 2) {
          graph->edges = malloc(graph->nof_edges * sizeof(*graph->edges));
          graph->nof_cycles = UINT_MAX;
          graph->cycles = NULL;
        }
        else {
          RDL_outputFunc(RDL_ERROR, "invalid line starting with 'p'\n");
          error = 1;
        }
      }
      else {
        RDL_outputFunc(RDL_ERROR, "duplicate 'p' line found!\n");
        error = 1;
      }
    }
    else if (line[0] == 'e') {
      if (stage != 1) {
        RDL_outputFunc(RDL_ERROR, "edge 'e' found without 'p' definition!\n");
        error = 1;
      }
      else {
        if (!sscanf(line, "e %u %u", &node1, &node2)) {
          RDL_outputFunc(RDL_ERROR, "invalid edge specification line\n");
          error = 1;
        }
        else if (edge_counter == graph->nof_edges) {
          RDL_outputFunc(RDL_ERROR, "too many edges found!\n");
          error = 1;
        }
        else if (node1 < 1 || node1 > graph->nof_nodes || node2 < 1 || node2 > graph->nof_nodes) {
          RDL_outputFunc(RDL_ERROR, "illegal edge specification!\n");
          error = 1;
        }
        else {
          graph->edges[edge_counter][0] = node1;
          graph->edges[edge_counter][1] = node2;
          ++edge_counter;
        }
      }
    }
    else if (line[0] == 'r') {
      if (!stage) {
        RDL_outputFunc(RDL_ERROR, "ring 'r' found without 'p' definition!\n");
        error = 1;
      }
      else if (!graph->cycles) {
        RDL_outputFunc(RDL_ERROR, "ring 'r' found without 'p' definition for rings!\n");
        error = 1;
      }
      else {
        stage = 2;
        if (sscanf(line, "r %u %u %u %u", &ring, &ring_size, &node1, &node2) != 4) {
          RDL_outputFunc(RDL_ERROR, "invalid ring specification line\n");
          error = 1;
        }
        else if (ring < 1|| ring > graph->nof_cycles) {
          RDL_outputFunc(RDL_ERROR, "invalid ring counter '%u'!\n", ring);
          error = 1;
        }
        else if (node1 < 1 || node1 > graph->nof_nodes || node2 < 1 || node2 > graph->nof_nodes) {
          RDL_outputFunc(RDL_ERROR, "illegal edge specification!\n");
          error = 1;
        }
        else {
          if (ring != last_ring) {
            if (last_ring) {
              if (ring_position_counter != graph->cycles[last_ring-1]->weight) {
                RDL_outputFunc(RDL_ERROR, "last ring %u wasn't filled up!\n", last_ring);
                error = 1;
              }
              else if (ring != last_ring + 1) {
                RDL_outputFunc(RDL_ERROR, "rings have to be continuous, '%u' follows on '%u'", ring, last_ring);
                error = 1;
              }
            }

            ring_position_counter = 0;
            graph->cycles[ring-1] = malloc(sizeof(**graph->cycles));
            graph->cycles[ring-1]->weight = ring_size;
            graph->cycles[ring-1]->edges = malloc(ring_size * sizeof(*graph->cycles[ring-1]->edges));
            last_ring = ring;
            ++ring_counter;
          }

          if (ring_position_counter == graph->cycles[ring-1]->weight) {
            RDL_outputFunc(RDL_ERROR, "too many edges for ring!\n");
            error = 1;
          }
          else {
            graph->cycles[ring-1]->edges[ring_position_counter][0] = node1;
            graph->cycles[ring-1]->edges[ring_position_counter][1] = node2;
            ++ring_position_counter;
          }
        }
      }
    }
    else if (line[0] == 'c') {
      len = strlen(line);
      if (!graph->name && len > 3) {
        /* skip first two characters (but reserve +1 for \0 and -1 for the newline) */
        graph->name = malloc((len - 2) * sizeof(*graph->name));
        strncpy(graph->name, line + 2, len - 3);
        graph->name[len - 3] = '\0';
      }
    }
    else {
      RDL_outputFunc(RDL_ERROR, "invalid line!\n");
      error = 1;
    }
  }

  if (!error && graph->nof_cycles != UINT_MAX) {
    if (ring_counter != graph->nof_cycles) {
      RDL_outputFunc(RDL_ERROR, "mismatch between number of cycles!\n");
      error = 1;
    }

    if (last_ring) {
      if (ring_position_counter != graph->cycles[last_ring-1]->weight) {
        RDL_outputFunc(RDL_ERROR, "last ring %u wasn't filled up!\n", last_ring);
        error = 1;
      }
    }
  }

  if (!error && edge_counter != graph->nof_edges) {
    RDL_outputFunc(RDL_ERROR, "mismatch between number of edges!\n");
    error = 1;
  }

  if (error && graph) {
    RDL_dimacsGraph_delete(graph);
    graph = NULL;
  }

  fclose(infile);

  if (!error) {
    if (graph->cycles) {
      graph->sorted_cycles = malloc(graph->nof_cycles * sizeof(*graph->sorted_cycles));
      for (ring_idx = 0; ring_idx < graph->nof_cycles; ++ring_idx) {
        graph->sorted_cycles[ring_idx] = malloc((graph->nof_edges + 1) * sizeof(**graph->sorted_cycles));
        memset(graph->sorted_cycles[ring_idx], 0, graph->nof_edges * sizeof(**graph->sorted_cycles));
        graph->sorted_cycles[ring_idx][graph->nof_edges] = 2;
        for (edge_idx = 0; edge_idx < graph->cycles[ring_idx]->weight; ++edge_idx) {
          edge[0] = graph->cycles[ring_idx]->edges[edge_idx][0];
          edge[1] = graph->cycles[ring_idx]->edges[edge_idx][1];
          for (eidx = 0; eidx < graph->nof_edges; ++eidx) {
            if ((graph->edges[eidx][0] == edge[0]&& graph->edges[eidx][1] == edge[1])
                || (graph->edges[eidx][0] == edge[1] && graph->edges[eidx][1] == edge[0])) {
              found_eidx = eidx;
            }
          }
          graph->sorted_cycles[ring_idx][found_eidx] = 1;
        }
      }

      qsort(graph->sorted_cycles, graph->nof_cycles, sizeof(*graph->sorted_cycles), RDL_cmp_cycles);
    }
    else {
      graph->sorted_cycles = NULL;
    }
  }

  return graph;
}